

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::truncate
          (ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> *this,char *__file,__off_t __length)

{
  Own<capnp::_::SegmentBuilder> *pOVar1;
  Own<capnp::_::SegmentBuilder> *pOVar2;
  Own<capnp::_::SegmentBuilder> *pOVar3;
  
  pOVar1 = this->ptr;
  pOVar3 = this->pos;
  while (pOVar2 = pOVar3, pOVar1 + (long)__file < pOVar2) {
    this->pos = pOVar2 + -1;
    pOVar3 = pOVar2 + -1;
    if (pOVar2[-1].ptr != (SegmentBuilder *)0x0) {
      pOVar2[-1].ptr = (SegmentBuilder *)0x0;
      (**(pOVar2[-1].disposer)->_vptr_Disposer)();
      pOVar3 = this->pos;
    }
  }
  return (int)pOVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }